

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O1

int gzip_read_header(archive_read_filter *self,archive_entry *entry)

{
  void *pvVar1;
  char *name;
  ulong t;
  
  pvVar1 = self->data;
  t = (ulong)*(uint *)((long)pvVar1 + 0x98);
  if (t != 0) {
    archive_entry_set_mtime(entry,t,0);
  }
  name = *(char **)((long)pvVar1 + 0xa0);
  if (name != (char *)0x0) {
    archive_entry_set_pathname(entry,name);
  }
  return 0;
}

Assistant:

static int
gzip_read_header(struct archive_read_filter *self, struct archive_entry *entry)
{
	struct private_data *state;

	state = (struct private_data *)self->data;

	/* A mtime of 0 is considered invalid/missing. */
	if (state->mtime != 0)
		archive_entry_set_mtime(entry, state->mtime, 0);

	/* If the name is available, extract it. */
	if (state->name)
		archive_entry_set_pathname(entry, state->name);

	return (ARCHIVE_OK);
}